

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SpawnPlayerMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  int aimflags;
  undefined4 extraout_var;
  VMValue *pVVar4;
  AActor *pAVar5;
  PClassActor *pPVar6;
  FTranslatedLineTarget *pLineTarget;
  PClassActor *type;
  char *pcVar7;
  bool bVar8;
  void *x;
  void *y;
  double z;
  AActor *missileactor;
  DAngle local_38;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0043193b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431922:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043193b:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad0,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar5 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar5 == (AActor *)0x0) goto LAB_00431672;
    pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar5->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar8 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar8) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar8 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0043193b;
    }
  }
  else {
    if (pAVar5 != (AActor *)0x0) goto LAB_00431922;
LAB_00431672:
    pAVar5 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0043195a;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0043192b:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0043195a:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ad1,
                  "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_004316d3;
    pPVar6 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
        if (pPVar6 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar6 != (PClassActor *)0x0);
      if (pPVar6 == (PClassActor *)0x0) {
        pcVar7 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_0043195a;
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_0043192b;
LAB_004316d3:
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    pVVar4 = defaultparam->Array;
    if (pVVar4[2].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_00431a26;
    }
    local_38.Degrees = (double)pVVar4[2].field_0.field_1.a;
LAB_0043170d:
    if (pVVar4[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_00431a45:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad3,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    x = pVVar4[3].field_0.field_1.a;
LAB_0043171c:
    if (pVVar4[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004319f5:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad4,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    y = pVVar4[4].field_0.field_1.a;
LAB_0043172b:
    if (pVVar4[5].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004319d6:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad5,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    z = pVVar4[5].field_0.f;
LAB_0043173a:
    if ((pVVar4[6].field_0.field_3.Type != '\x03') || (pVVar4[6].field_0.field_1.atag != 0)) {
      pcVar7 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
      ;
LAB_0043190a:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad6,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pLineTarget = (FTranslatedLineTarget *)pVVar4[6].field_0.field_1.a;
LAB_00431752:
    if (pVVar4[7].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004319b7:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad7,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar8 = pVVar4[7].field_0.i != 0;
LAB_00431764:
    if (pVVar4[8].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00431998:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad8,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (pVVar4[9].field_0.field_3.Type == '\0') {
      iVar2 = pVVar4[8].field_0.i;
      aimflags = pVVar4[9].field_0.i;
      if (numparam == 2) {
        local_38.Degrees = (pAVar5->Angles).Yaw.Degrees;
      }
LAB_00431798:
      pAVar5 = P_SpawnPlayerMissile
                         (pAVar5,(double)x,(double)y,z,type,&local_38,pLineTarget,&missileactor,
                          bVar8,iVar2 != 0,aimflags);
      if (0 < numret) {
        VMReturn::SetPointer(ret,pAVar5,1);
        bVar8 = numret != 1;
        numret = 1;
        if (bVar8) {
          VMReturn::SetPointer(ret + 1,missileactor,1);
          numret = 2;
        }
      }
      return numret;
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00431a26:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad2,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_38.Degrees = (double)param[2].field_0.field_1.a;
    if (numparam == 3) {
      pVVar4 = defaultparam->Array;
      goto LAB_0043170d;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_00431a45;
    }
    x = (void *)param[3].field_0.f;
    if ((uint)numparam < 5) {
      pVVar4 = defaultparam->Array;
      goto LAB_0043171c;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_004319f5;
    }
    y = (void *)param[4].field_0.f;
    if (numparam == 5) {
      pVVar4 = defaultparam->Array;
      goto LAB_0043172b;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_004319d6;
    }
    z = param[5].field_0.f;
    if ((uint)numparam < 7) {
      pVVar4 = defaultparam->Array;
      goto LAB_0043173a;
    }
    if ((param[6].field_0.field_3.Type != '\x03') || (param[6].field_0.field_1.atag != 0)) {
      pcVar7 = "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
      goto LAB_0043190a;
    }
    pLineTarget = (FTranslatedLineTarget *)param[6].field_0.field_1.a;
    if (numparam == 7) {
      pVVar4 = defaultparam->Array;
      goto LAB_00431752;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_004319b7;
    }
    bVar8 = param[7].field_0.i != 0;
    if ((uint)numparam < 9) {
      pVVar4 = defaultparam->Array;
      goto LAB_00431764;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00431998;
    }
    iVar2 = param[8].field_0.i;
    if (numparam != 9) {
      if (param[9].field_0.field_3.Type == '\0') {
        aimflags = param[9].field_0.i;
        goto LAB_00431798;
      }
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00431979;
    }
    if (defaultparam->Array[9].field_0.field_3.Type == '\0') {
      aimflags = defaultparam->Array[9].field_0.i;
      goto LAB_00431798;
    }
  }
  pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00431979:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1ad9,
                "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnPlayerMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AActor);
	PARAM_ANGLE_DEF(angle);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_POINTER_DEF(lt, FTranslatedLineTarget);
	PARAM_BOOL_DEF(nofreeaim);
	PARAM_BOOL_DEF(noautoaim);
	PARAM_INT_DEF(aimflags);
	AActor *missileactor;
	if (numparam == 2) angle = self->Angles.Yaw;
	AActor *misl = P_SpawnPlayerMissile(self, x, y, z, type, angle, lt, &missileactor, nofreeaim, noautoaim, aimflags);
	if (numret > 0) ret[0].SetPointer(misl, ATAG_OBJECT);
	if (numret > 1) ret[1].SetPointer(missileactor, ATAG_OBJECT), numret = 2;
	return numret;
}